

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O2

void dis_dopp(decoctx *deco,dis_res *dres,uint64_t pos)

{
  easm_insn *peVar1;
  easm_subinsn *peVar2;
  int i_1;
  long lVar3;
  int i;
  long lVar4;
  
  peVar1 = dres->insn;
  for (lVar4 = 0; lVar4 < peVar1->subinsnsnum; lVar4 = lVar4 + 1) {
    peVar2 = peVar1->subinsns[lVar4];
    for (lVar3 = 0; lVar3 < peVar2->prefsnum; lVar3 = lVar3 + 1) {
      dis_pp_expr(deco,dres,peVar2->prefs[lVar3],pos);
    }
    dis_pp_sinsn(deco,dres,peVar2->sinsn,pos);
  }
  return;
}

Assistant:

void dis_dopp(struct decoctx *deco, struct dis_res *dres, uint64_t pos) {
	dis_pp_insn(deco, dres, dres->insn, pos);
}